

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_help.c
# Opt level: O2

void tool_help(char *category)

{
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  curlhelp_t category_00;
  
  puts("Usage: curl [options...] <url>");
  if (category == (char *)0x0) {
    print_category(0x200);
    puts(
        "\nThis is not the full help, this menu is stripped into categories.\nUse \"--help category\" to get an overview of all categories.\nFor all options use the manual or \"--help all\"."
        );
  }
  else {
    iVar3 = curl_strequal(category,"all");
    if (iVar3 == 0) {
      iVar3 = curl_strequal(category,"category");
      if (iVar3 != 0) {
LAB_00112bbc:
        get_categories();
        goto LAB_00112bc1;
      }
      lVar2 = 0;
      do {
        lVar4 = lVar2;
        if (lVar4 + 0x18 == 0x228) {
          puts("Invalid category provided, here is a list of all categories:\n");
          goto LAB_00112bbc;
        }
        uVar1 = *(undefined8 *)((long)&categories[0].opt + lVar4);
        iVar3 = curl_strequal(uVar1,category);
        lVar2 = lVar4 + 0x18;
      } while (iVar3 == 0);
      printf("%s: %s\n",uVar1,*(undefined8 *)((long)&categories[0].desc + lVar4));
      category_00 = *(curlhelp_t *)((long)&categories[0].category + lVar4);
    }
    else {
      category_00 = 0xfffffffe;
    }
    print_category(category_00);
  }
LAB_00112bc1:
  free(category);
  return;
}

Assistant:

void tool_help(char *category)
{
  puts("Usage: curl [options...] <url>");
  /* If no category was provided */
  if(!category) {
    const char *category_note = "\nThis is not the full help, this "
      "menu is stripped into categories.\nUse \"--help category\" to get "
      "an overview of all categories.\nFor all options use the manual"
      " or \"--help all\".";
    print_category(CURLHELP_IMPORTANT);
    puts(category_note);
  }
  /* Lets print everything if "all" was provided */
  else if(curl_strequal(category, "all"))
    /* Print everything except hidden */
    print_category(~(CURLHELP_HIDDEN));
  /* Lets handle the string "category" differently to not print an errormsg */
  else if(curl_strequal(category, "category"))
    get_categories();
  /* Otherwise print category and handle the case if the cat was not found */
  else if(get_category_content(category)) {
    puts("Invalid category provided, here is a list of all categories:\n");
    get_categories();
  }
  free(category);
}